

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::handleBlockWithUnknownJump
          (RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder> *this,RABlock *block)

{
  StringTmp<512UL> *this_00;
  uint uVar1;
  BaseRAPass *pBVar2;
  Error EVar3;
  char *in_RCX;
  uint extraout_EDX;
  char *pcVar4;
  ulong uVar5;
  RABlock *successor;
  RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder> *pRVar6;
  RABlock *pRVar7;
  
  pBVar2 = this->_pass;
  uVar1 = (pBVar2->_blocks).super_ZoneVectorBase._size;
  if ((block->_flags & kHasConsecutive) == kNone) {
    pRVar7 = (RABlock *)0x0;
  }
  else {
    if ((block->_successors).super_ZoneVectorBase._size == 0) {
LAB_00136f7a:
      handleBlockWithUnknownJump();
      this_00 = &this->_sb;
      String::clear(&this_00->super_String);
      String::_opChars(&this_00->super_String,kAppend,' ',(ulong)extraout_EDX);
      if (in_RCX != (char *)0x0) {
        String::_opString(&this_00->super_String,kAppend,in_RCX,0xffffffffffffffff);
        String::_opChar(&this_00->super_String,kAppend,' ');
      }
      Formatter::formatNode
                (&this_00->super_String,(FormatOptions *)&this->_formatOptions,
                 &this->_cc->super_BaseBuilder,(BaseNode *)block);
      String::_opChar(&this_00->super_String,kAppend,'\n');
      uVar5 = (ulong)(this->_sb).super_String.field_0._type;
      if (uVar5 < 0x1f) {
        pcVar4 = (char *)((long)&(this->_sb).super_String.field_0 + 1);
      }
      else {
        uVar5 = (this->_sb).super_String.field_0._large.size;
        pcVar4 = (this->_sb).super_String.field_0._large.data;
      }
      EVar3 = (*(code *)(((RABlock *)this->_logger)->_ra->super_FuncPass).super_Pass._name)
                        ((RABlock *)this->_logger,pcVar4,uVar5);
      return EVar3;
    }
    pRVar7 = *(block->_successors).super_ZoneVectorBase._data;
  }
  if (1 < uVar1) {
    uVar5 = 1;
    successor = block;
    pRVar6 = this;
    do {
      if ((pBVar2->_blocks).super_ZoneVectorBase._size <= uVar5) {
        handleBlockWithUnknownJump();
        block = successor;
        this = pRVar6;
        goto LAB_00136f7a;
      }
      successor = *(RABlock **)((long)(pBVar2->_blocks).super_ZoneVectorBase._data + uVar5 * 8);
      if ((successor != pRVar7) && ((successor->_flags & kIsTargetable) != kNone)) {
        pRVar6 = (RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder> *)block;
        RABlock::appendSuccessor(block,successor);
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  EVar3 = shareAssignmentAcrossSuccessors(this,block);
  return EVar3;
}

Assistant:

Error handleBlockWithUnknownJump(RABlock* block) noexcept {
    RABlocks& blocks = _pass->blocks();
    size_t blockCount = blocks.size();

    // NOTE: Iterate from `1` as the first block is the entry block, we don't
    // allow the entry to be a successor of any block.
    RABlock* consecutive = block->consecutive();
    for (size_t i = 1; i < blockCount; i++) {
      RABlock* candidate = blocks[i];
      if (candidate == consecutive || !candidate->isTargetable())
        continue;
      block->appendSuccessor(candidate);
    }

    return shareAssignmentAcrossSuccessors(block);
  }